

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDComponentFilter *
ON_SubDComponentFilter::Create
          (ON_SubDComponentFilter *__return_storage_ptr__,bool bAcceptVertices,bool bAcceptEdges,
          bool bAcceptFaces)

{
  undefined3 in_register_00000031;
  
  __return_storage_ptr__->m_bRejectVertices = false;
  __return_storage_ptr__->m_vertex_topology_filter = Unset;
  __return_storage_ptr__->m_vertex_tag_filter[0] = Unset;
  __return_storage_ptr__->m_vertex_tag_filter[1] = Unset;
  __return_storage_ptr__->m_vertex_tag_filter[2] = Unset;
  __return_storage_ptr__->m_vertex_tag_filter[3] = Unset;
  __return_storage_ptr__->m_bRejectEdges = false;
  __return_storage_ptr__->m_edge_topology_filter = Unset;
  __return_storage_ptr__->m_edge_tag_filter[0] = Unset;
  __return_storage_ptr__->m_edge_tag_filter[1] = Unset;
  __return_storage_ptr__->m_bRejectFaces = false;
  __return_storage_ptr__->m_face_topology_filter = Unset;
  __return_storage_ptr__->m_minimum_face_edge_count = 0;
  __return_storage_ptr__->m_maximum_face_edge_count = 0;
  if (CONCAT31(in_register_00000031,bAcceptVertices) == 0) {
    __return_storage_ptr__->m_bRejectVertices = true;
  }
  if (!bAcceptEdges) {
    __return_storage_ptr__->m_bRejectEdges = true;
  }
  if (!bAcceptFaces) {
    __return_storage_ptr__->m_bRejectFaces = true;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentFilter ON_SubDComponentFilter::Create(
  bool bAcceptVertices,
  bool bAcceptEdges,
  bool bAcceptFaces
)
{
  ON_SubDComponentFilter f;
  if (false == bAcceptVertices)
    f.m_bRejectVertices = true;
  if (false == bAcceptEdges)
    f.m_bRejectEdges = true;
  if (false == bAcceptFaces)
    f.m_bRejectFaces = true;
  return f;
}